

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void md5_digest(ssh_hash *hash,uint8_t *digest)

{
  ulong local_28;
  size_t i;
  md5 *s;
  uint8_t *digest_local;
  ssh_hash *hash_local;
  
  md5_block_pad((md5_block *)&hash[-7].binarysink_,(BinarySink *)&hash[-2].binarysink_);
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    PUT_32BIT_LSB_FIRST(digest + local_28 * 4,*(uint32_t *)((long)hash + local_28 * 4 + -0x78));
  }
  return;
}

Assistant:

static void md5_digest(ssh_hash *hash, uint8_t *digest)
{
    md5 *s = container_of(hash, md5, hash);

    md5_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < 4; i++)
        PUT_32BIT_LSB_FIRST(digest + 4*i, s->core[i]);
}